

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O2

Fad<double> * __thiscall
Fad<double>::operator=(Fad<double> *this,FadExpr<FadUnaryMin<Fad<double>_>_> *fadexpr)

{
  uint ssize;
  double *pdVar1;
  Fad<double> *pFVar2;
  ulong uVar3;
  ulong uVar4;
  
  pFVar2 = (fadexpr->fadexpr_).expr_;
  ssize = (pFVar2->dx_).num_elts;
  if (ssize != (this->dx_).num_elts) {
    Vector<double>::resize(&this->dx_,ssize);
    pFVar2 = (fadexpr->fadexpr_).expr_;
  }
  if (ssize != 0) {
    pdVar1 = (this->dx_).ptr_to_data;
    uVar3 = 0;
    if (0 < (int)ssize) {
      uVar3 = (ulong)ssize;
    }
    if ((pFVar2->dx_).num_elts == 0) {
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        pdVar1[uVar4] = -pFVar2->defaultVal;
      }
    }
    else {
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        pdVar1[uVar4] = -(pFVar2->dx_).ptr_to_data[uVar4];
      }
    }
  }
  this->val_ = -pFVar2->val_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}